

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::NegativeOffsetXIntraCellVerticalLinesProduceNegativeCoverAndArea
          (VectorRasterizerTests *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cells_container *pcVar5;
  allocator local_199;
  string local_198 [32];
  LocationInfo local_178;
  undefined1 local_150 [8];
  cell reference3 [1];
  LocationInfo local_120;
  undefined1 local_f8 [8];
  cell reference2 [1];
  LocationInfo local_c8;
  undefined1 local_a0 [8];
  cell reference1 [1];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(15.1);
  iVar2 = anon_unknown_5::fp(10.1);
  iVar3 = anon_unknown_5::fp(15.1);
  iVar4 = anon_unknown_5::fp(10.05);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  local_a0._0_2_ = 0xf;
  local_a0._2_2_ = 10;
  local_a0._4_4_ = -0x2a4;
  reference1[0].x = -0xd;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&reference2[0].cover,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)((long)&reference2[0].area + 3));
  ut::LocationInfo::LocationInfo(&local_c8,(string *)&reference2[0].cover,0x1da);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])local_a0,pcVar5,&local_c8);
  ut::LocationInfo::~LocationInfo(&local_c8);
  std::__cxx11::string::~string((string *)&reference2[0].cover);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[0].area + 3));
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(53.172);
  iVar2 = anon_unknown_5::fp(9.0);
  iVar3 = anon_unknown_5::fp(53.172);
  iVar4 = anon_unknown_5::fp(8.0);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  local_f8._0_2_ = 0x35;
  local_f8._2_2_ = 8;
  local_f8._4_4_ = -0x5800;
  reference2[0].x = -0x100;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&reference3[0].cover,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)((long)&reference3[0].area + 3));
  ut::LocationInfo::LocationInfo(&local_120,(string *)&reference3[0].cover,0x1e7);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])local_f8,pcVar5,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string((string *)&reference3[0].cover);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference3[0].area + 3));
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(-3000.75);
  iVar2 = anon_unknown_5::fp(-9.8);
  iVar3 = anon_unknown_5::fp(-3000.75);
  iVar4 = anon_unknown_5::fp(-10.0);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  local_150._0_2_ = -0xbb9;
  local_150._2_2_ = -10;
  local_150._4_4_ = -0x1980;
  reference3[0].x = -0x33;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_199);
  ut::LocationInfo::LocationInfo(&local_178,(string *)local_198,500);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])local_150,pcVar5,&local_178);
  ut::LocationInfo::~LocationInfo(&local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( NegativeOffsetXIntraCellVerticalLinesProduceNegativeCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(15.1), fp(10.1), fp(15.1), fp(10.05));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 15, 10, -676, -13 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(53.172), fp(9.0), fp(53.172), fp(8.0));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 53, 8, -22528, -256 },
				};

				assert_equal(reference2, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(-3000.75), fp(-9.8), fp(-3000.75), fp(-10.0));

				// ASSERT
				const vector_rasterizer::cell reference3[] = {
					{ -3001, -10, -6528, -51 },
				};

				assert_equal(reference3, vr.cells());
			}